

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

uint __thiscall
llvm::DWARFVerifier::verifyNameIndexAttribute
          (DWARFVerifier *this,NameIndex *NI,Abbrev *Abbr,AttributeEncoding AttrEnc)

{
  anon_class_8_1_be58efe9_for__M_pred P;
  bool bVar1;
  raw_ostream *prVar2;
  iterator pFVar3;
  iterator pFVar4;
  uint Encoding;
  uint64_t local_2c8;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>_>
  local_2c0;
  DWARFFormValue local_230;
  uint64_t local_200;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>_>_>
  local_1f8;
  Index local_188;
  Form FStack_184;
  undefined2 uStack_182;
  iterator local_180;
  iterator Iter;
  ArrayRef<FormClassTable> TableRef;
  uint64_t local_160;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form>_>_>
  local_158;
  uint64_t local_c8;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>_>_>
  local_c0;
  undefined1 local_40 [8];
  StringRef FormName;
  Abbrev *Abbr_local;
  NameIndex *NI_local;
  DWARFVerifier *this_local;
  Form aFStack_10 [2];
  AttributeEncoding AttrEnc_local;
  
  aFStack_10[0] = AttrEnc.Form;
  Encoding = (uint)aFStack_10[0];
  FormName.Length = (size_t)Abbr;
  unique0x1000034a = AttrEnc;
  _local_40 = dwarf::FormEncodingString(Encoding);
  bVar1 = StringRef::empty((StringRef *)local_40);
  if (bVar1) {
    prVar2 = error(this);
    local_c8 = DWARFDebugNames::NameIndex::getUnitOffset(NI);
    formatv<unsigned_long,_const_unsigned_int_&,_llvm::dwarf::Index_&,_llvm::dwarf::Form_&>
              (&local_c0,"NameIndex @ {0:x}: Abbreviation {1:x}: {2} uses an unknown form: {3}.\n",
               &local_c8,(uint *)FormName.Length,(Index *)((long)&this_local + 4),aFStack_10);
    raw_ostream::operator<<(prVar2,&local_c0.super_formatv_object_base);
    formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>_>_>
    ::~formatv_object(&local_c0);
    AttrEnc_local.Index = DW_IDX_compile_unit;
  }
  else if ((this_local._4_4_ == DW_IDX_type_hash) && (aFStack_10[0] != DW_FORM_data8)) {
    prVar2 = error(this);
    local_160 = DWARFDebugNames::NameIndex::getUnitOffset(NI);
    TableRef.Length._6_2_ = 7;
    formatv<unsigned_long,_const_unsigned_int_&,_llvm::dwarf::Form_&,_llvm::dwarf::Form>
              (&local_158,
               "NameIndex @ {0:x}: Abbreviation {1:x}: DW_IDX_type_hash uses an unexpected form {2} (should be {3}).\n"
               ,&local_160,(uint *)FormName.Length,aFStack_10,(Form *)((long)&TableRef.Length + 6));
    raw_ostream::operator<<(prVar2,&local_158.super_formatv_object_base);
    formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form>_>_>
    ::~formatv_object(&local_158);
    AttrEnc_local.Index = DW_IDX_compile_unit;
  }
  else {
    ArrayRef<llvm::DWARFVerifier::verifyNameIndexAttribute(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::Abbrev_const&,llvm::DWARFDebugNames::AttributeEncoding)::FormClassTable>
    ::ArrayRef<4ul>((ArrayRef<llvm::DWARFVerifier::verifyNameIndexAttribute(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::Abbrev_const&,llvm::DWARFDebugNames::AttributeEncoding)::FormClassTable>
                     *)&Iter,&verifyNameIndexAttribute::Table);
    local_188 = this_local._4_4_;
    FStack_184 = aFStack_10[0];
    P.AttrEnc._6_2_ = uStack_182;
    P.AttrEnc.Index = (int)this_local._4_6_;
    P.AttrEnc.Form = (short)((uint6)this_local._4_6_ >> 0x20);
    pFVar3 = find_if<llvm::ArrayRef<llvm::DWARFVerifier::verifyNameIndexAttribute(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::Abbrev_const&,llvm::DWARFDebugNames::AttributeEncoding)::FormClassTable>&,llvm::DWARFVerifier::verifyNameIndexAttribute(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::Abbrev_const&,llvm::DWARFDebugNames::AttributeEncoding)::__0>
                       ((ArrayRef<FormClassTable> *)&Iter,P);
    local_180 = pFVar3;
    pFVar4 = ArrayRef<FormClassTable>::end((ArrayRef<FormClassTable> *)&Iter);
    if (pFVar3 == pFVar4) {
      prVar2 = warn(this);
      local_200 = DWARFDebugNames::NameIndex::getUnitOffset(NI);
      formatv<unsigned_long,_const_unsigned_int_&,_llvm::dwarf::Index_&>
                (&local_1f8,
                 "NameIndex @ {0:x}: Abbreviation {1:x} contains an unknown index attribute: {2}.\n"
                 ,&local_200,(uint *)FormName.Length,(Index *)((long)&this_local + 4));
      raw_ostream::operator<<(prVar2,&local_1f8.super_formatv_object_base);
      formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>_>_>
      ::~formatv_object(&local_1f8);
      AttrEnc_local.Index = 0;
    }
    else {
      DWARFFormValue::DWARFFormValue(&local_230,aFStack_10[0]);
      bVar1 = DWARFFormValue::isFormClass(&local_230,local_180->Class);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        AttrEnc_local.Index = 0;
      }
      else {
        prVar2 = error(this);
        local_2c8 = DWARFDebugNames::NameIndex::getUnitOffset(NI);
        formatv<unsigned_long,_const_unsigned_int_&,_llvm::dwarf::Index_&,_llvm::dwarf::Form_&,_const_llvm::StringLiteral_&>
                  (&local_2c0,
                   "NameIndex @ {0:x}: Abbreviation {1:x}: {2} uses an unexpected form {3} (expected form class {4}).\n"
                   ,&local_2c8,(uint *)FormName.Length,(Index *)((long)&this_local + 4),aFStack_10,
                   &local_180->ClassName);
        raw_ostream::operator<<(prVar2,&local_2c0.super_formatv_object_base);
        formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>_>
        ::~formatv_object(&local_2c0);
        AttrEnc_local.Index = DW_IDX_compile_unit;
      }
    }
  }
  return AttrEnc_local.Index;
}

Assistant:

unsigned DWARFVerifier::verifyNameIndexAttribute(
    const DWARFDebugNames::NameIndex &NI, const DWARFDebugNames::Abbrev &Abbr,
    DWARFDebugNames::AttributeEncoding AttrEnc) {
  StringRef FormName = dwarf::FormEncodingString(AttrEnc.Form);
  if (FormName.empty()) {
    error() << formatv("NameIndex @ {0:x}: Abbreviation {1:x}: {2} uses an "
                       "unknown form: {3}.\n",
                       NI.getUnitOffset(), Abbr.Code, AttrEnc.Index,
                       AttrEnc.Form);
    return 1;
  }

  if (AttrEnc.Index == DW_IDX_type_hash) {
    if (AttrEnc.Form != dwarf::DW_FORM_data8) {
      error() << formatv(
          "NameIndex @ {0:x}: Abbreviation {1:x}: DW_IDX_type_hash "
          "uses an unexpected form {2} (should be {3}).\n",
          NI.getUnitOffset(), Abbr.Code, AttrEnc.Form, dwarf::DW_FORM_data8);
      return 1;
    }
  }

  // A list of known index attributes and their expected form classes.
  // DW_IDX_type_hash is handled specially in the check above, as it has a
  // specific form (not just a form class) we should expect.
  struct FormClassTable {
    dwarf::Index Index;
    DWARFFormValue::FormClass Class;
    StringLiteral ClassName;
  };
  static constexpr FormClassTable Table[] = {
      {dwarf::DW_IDX_compile_unit, DWARFFormValue::FC_Constant, {"constant"}},
      {dwarf::DW_IDX_type_unit, DWARFFormValue::FC_Constant, {"constant"}},
      {dwarf::DW_IDX_die_offset, DWARFFormValue::FC_Reference, {"reference"}},
      {dwarf::DW_IDX_parent, DWARFFormValue::FC_Constant, {"constant"}},
  };

  ArrayRef<FormClassTable> TableRef(Table);
  auto Iter = find_if(TableRef, [AttrEnc](const FormClassTable &T) {
    return T.Index == AttrEnc.Index;
  });
  if (Iter == TableRef.end()) {
    warn() << formatv("NameIndex @ {0:x}: Abbreviation {1:x} contains an "
                      "unknown index attribute: {2}.\n",
                      NI.getUnitOffset(), Abbr.Code, AttrEnc.Index);
    return 0;
  }

  if (!DWARFFormValue(AttrEnc.Form).isFormClass(Iter->Class)) {
    error() << formatv("NameIndex @ {0:x}: Abbreviation {1:x}: {2} uses an "
                       "unexpected form {3} (expected form class {4}).\n",
                       NI.getUnitOffset(), Abbr.Code, AttrEnc.Index,
                       AttrEnc.Form, Iter->ClassName);
    return 1;
  }
  return 0;
}